

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

void dgrminer::save_pattern
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<int,_std::allocator<int>_> *graph_ids,results_crate *results,
               bool set_of_graphs,PartialUnion *pu,int pattern_support_absolute,
               double support_relative,
               set<int,_std::less<int>,_std::allocator<int>_> *antecedent_occurrences,
               double confidence,bool verbose)

{
  pointer *ppaVar1;
  iterator __position;
  iterator iVar2;
  iterator iVar3;
  iterator __position_00;
  size_type sVar4;
  pointer piVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  pointer paVar7;
  long lVar8;
  allocator_type local_dd;
  int pattern_support_absolute_local;
  array<int,_6UL> result_edge;
  double confidence_local;
  double support_relative_local;
  undefined4 local_94;
  vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *local_90;
  vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>> *local_88;
  PartialUnion *local_80;
  vector<int,_std::allocator<int>_> occurrences_vector;
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  
  results->saved_instances = results->saved_instances + 1;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pattern_support_absolute_local = pattern_support_absolute;
  confidence_local = confidence;
  support_relative_local = support_relative;
  local_80 = pu;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (verbose) {
    println<char[18],int,char[8],double,char[3],int,char[20],double>
              ((char (*) [18])"FREQUENT PATTERN ",&results->saved_instances,(char (*) [8])", SUP: ",
               &support_relative_local,(char (*) [3])0x168e0d,&pattern_support_absolute_local,
               (char (*) [20])" INSTANCES), CONF: ",&confidence_local);
  }
  result_edge._M_elems._0_8_ = SEXT48(pattern_support_absolute_local);
  __position._M_current =
       (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&results->support_absolute,__position,(unsigned_long *)&result_edge);
  }
  else {
    *__position._M_current = result_edge._M_elems._0_8_;
    (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar2._M_current =
       (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&results->support,iVar2,
               &support_relative_local);
  }
  else {
    *iVar2._M_current = support_relative_local;
    (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if (0.0 <= confidence_local) {
    iVar2._M_current =
         (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&results->confidence,iVar2,
                 &confidence_local);
    }
    else {
      *iVar2._M_current = confidence_local;
      (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  local_94 = (undefined4)CONCAT71(in_register_00000009,set_of_graphs);
  paVar7 = (edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((edge_list->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != paVar7) {
    local_90 = (vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               &results->result_nodes;
    local_88 = (vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>> *)
               &results->result_edges;
    lVar8 = 0;
    uVar6 = 0;
    do {
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&already_saved_node_ids,(key_type *)((long)paVar7->_M_elems + lVar8));
      if (sVar4 == 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &already_saved_node_ids,
                   (int *)((long)((edge_list->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8));
        paVar7 = (edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        result_edge._M_elems[1] = *(int *)((long)paVar7->_M_elems + lVar8);
        result_edge._M_elems[0] = results->saved_instances;
        result_edge._M_elems[2] = *(int *)((long)paVar7->_M_elems + lVar8 + 8);
        result_edge._M_elems[3] = *(int *)((long)paVar7->_M_elems + lVar8 + 0xc);
        iVar3._M_current = *(array<int,_4UL> **)&results->field_0x10;
        if (iVar3._M_current == *(array<int,_4UL> **)&results->field_0x18) {
          std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
          _M_realloc_insert<std::array<int,4ul>const&>
                    (local_90,iVar3,(array<int,_4UL> *)&result_edge);
        }
        else {
          *(undefined8 *)(iVar3._M_current)->_M_elems = result_edge._M_elems._0_8_;
          *(ulong *)((iVar3._M_current)->_M_elems + 2) =
               CONCAT44(result_edge._M_elems[3],result_edge._M_elems[2]);
          *(long *)&results->field_0x10 = *(long *)&results->field_0x10 + 0x10;
        }
      }
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&already_saved_node_ids,
                         (key_type *)
                         ((long)((edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + 4))
      ;
      if (sVar4 == 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &already_saved_node_ids,
                   (int *)((long)((edge_list->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + 4)
                  );
        paVar7 = (edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        result_edge._M_elems[1] = *(int *)((long)paVar7->_M_elems + lVar8 + 4);
        result_edge._M_elems[0] = results->saved_instances;
        result_edge._M_elems[2] = *(int *)((long)paVar7->_M_elems + lVar8 + 0x1c);
        result_edge._M_elems[3] = *(int *)((long)paVar7->_M_elems + lVar8 + 0x20);
        iVar3._M_current = *(array<int,_4UL> **)&results->field_0x10;
        if (iVar3._M_current == *(array<int,_4UL> **)&results->field_0x18) {
          std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
          _M_realloc_insert<std::array<int,4ul>const&>
                    (local_90,iVar3,(array<int,_4UL> *)&result_edge);
        }
        else {
          *(undefined8 *)(iVar3._M_current)->_M_elems = result_edge._M_elems._0_8_;
          *(ulong *)((iVar3._M_current)->_M_elems + 2) =
               CONCAT44(result_edge._M_elems[3],result_edge._M_elems[2]);
          *(long *)&results->field_0x10 = *(long *)&results->field_0x10 + 0x10;
        }
      }
      paVar7 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      result_edge._M_elems[1] = *(int *)((long)paVar7->_M_elems + lVar8);
      result_edge._M_elems[0] = results->saved_instances;
      result_edge._M_elems[2] = *(int *)((long)paVar7->_M_elems + lVar8 + 4);
      result_edge._M_elems[3] = *(int *)((long)paVar7->_M_elems + lVar8 + 0x14);
      result_edge._M_elems[5] = *(int *)((long)paVar7->_M_elems + lVar8 + 0x18);
      result_edge._M_elems[4] = *(int *)((long)paVar7->_M_elems + lVar8 + 0x10);
      __position_00._M_current =
           (results->result_edges).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (results->result_edges).
          super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,6ul>,std::allocator<std::array<int,6ul>>>::
        _M_realloc_insert<std::array<int,6ul>const&>(local_88,__position_00,&result_edge);
      }
      else {
        *(undefined8 *)((__position_00._M_current)->_M_elems + 4) = result_edge._M_elems._16_8_;
        *(undefined8 *)(__position_00._M_current)->_M_elems = result_edge._M_elems._0_8_;
        *(ulong *)((__position_00._M_current)->_M_elems + 2) =
             CONCAT44(result_edge._M_elems[3],result_edge._M_elems[2]);
        ppaVar1 = &(results->result_edges).
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      paVar7 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x28;
    } while (uVar6 < (ulong)(((long)(edge_list->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar7 >> 3)
                            * -0x3333333333333333));
  }
  if ((char)local_94 == '\0') {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&result_edge,graph_ids);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results->occurrences,(value_type *)&result_edge);
    if (result_edge._M_elems._0_8_ != 0) {
      operator_delete((void *)result_edge._M_elems._0_8_);
    }
  }
  else {
    result_edge._M_elems[2] = 0;
    result_edge._M_elems[4] = 0;
    result_edge._M_elems[5] = 0;
    piVar5 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar5) {
      uVar6 = 0;
      do {
        occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             PartialUnion::queryMappingSnapshotsToGraphs(local_80,piVar5[uVar6]);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &result_edge,(int *)&occurrences_vector);
        uVar6 = uVar6 + 1;
        piVar5 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(graph_ids->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2))
      ;
    }
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&occurrences_vector,
               (_Base_ptr)(result_edge._M_elems + 2),(_Base_ptr)(result_edge._M_elems + 2),&local_dd
              );
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results->occurrences,&occurrences_vector);
    if ((void *)CONCAT44(occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)occurrences_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(occurrences_vector.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       (int)occurrences_vector.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &result_edge);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&already_saved_node_ids._M_t);
  return;
}

Assistant:

void save_pattern(std::vector<std::array<int, 10>> &edge_list, std::vector<int> &graph_ids, results_crate * results,
                      bool set_of_graphs, PartialUnion pu, int pattern_support_absolute, double support_relative,
                      std::set<int> &antecedent_occurrences, double confidence = -1.0, bool verbose = false)
	{
		results->saved_instances++;

		std::set<int> already_saved_node_ids;
        debug_println(verbose, "FREQUENT PATTERN ", results->saved_instances, ", SUP: ", support_relative, " (",
                      pattern_support_absolute, " INSTANCES), CONF: ", confidence);

		results->support_absolute.push_back(pattern_support_absolute);
		results->support.push_back(support_relative);
		if (confidence >= 0)
		{
			results->confidence.push_back(confidence);
		}


		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results->result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results->result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results->saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results->result_edges.push_back(result_edge);
		}

		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(graph_ids[j]));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results->occurrences.push_back(occurrences_vector);
		}
		else
		{

			std::vector<int> new_(graph_ids);
			results->occurrences.push_back(new_);
		}
	}